

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_pbio.c
# Opt level: O1

int CMpbio_get_port_callback(void *client_data)

{
  FILE *pFVar1;
  undefined4 uVar2;
  int iVar3;
  __pid_t _Var4;
  attr_list p_Var5;
  pthread_t pVar6;
  int int_port_num;
  timespec ts;
  uint local_2c;
  timespec local_28;
  
  p_Var5 = INT_CMget_contact_list((CManager_conflict)client_data);
  if (p_Var5 == (attr_list)0x0) {
    CMinternal_listen((CManager_conflict)client_data,(attr_list)0x0,1);
  }
  p_Var5 = INT_CMget_contact_list((CManager_conflict)client_data);
  uVar2 = attr_atom_from_string("IP_PORT");
  iVar3 = get_int_attr(p_Var5,uVar2,&local_2c);
  if (iVar3 == 0) {
    iVar3 = CMtrace_val[6];
    if (*(long *)((long)client_data + 0x120) == 0) {
      iVar3 = CMtrace_init((CManager)client_data,CMFormatVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = *(FILE **)((long)client_data + 0x120);
        _Var4 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_28);
        fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",local_28.tv_sec,
                local_28.tv_nsec);
      }
      fwrite("CMpbio port callback found no IP_PORT attribute\n",0x30,1,
             *(FILE **)((long)client_data + 0x120));
    }
    fflush(*(FILE **)((long)client_data + 0x120));
    local_2c = 0;
  }
  else {
    iVar3 = CMtrace_val[6];
    if (*(long *)((long)client_data + 0x120) == 0) {
      iVar3 = CMtrace_init((CManager)client_data,CMFormatVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = *(FILE **)((long)client_data + 0x120);
        _Var4 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_28);
        fprintf(*(FILE **)((long)client_data + 0x120),"%lld.%.9ld - ",local_28.tv_sec,
                local_28.tv_nsec);
      }
      fprintf(*(FILE **)((long)client_data + 0x120),"CMpbio port callback returning %d\n",
              (ulong)local_2c);
    }
    fflush(*(FILE **)((long)client_data + 0x120));
  }
  return local_2c;
}

Assistant:

extern int CMpbio_get_port_callback(void *client_data)
{
    CManager cm = (CManager) client_data;
    attr_list contact_attrs = INT_CMget_contact_list(cm);
    atom_t CM_IP_PORT = -1;
    int int_port_num;

    if (contact_attrs == NULL) {
	CMinternal_listen(cm, NULL, 1);
    }
    contact_attrs = INT_CMget_contact_list(cm);
    if (CM_IP_PORT == -1) {
	CM_IP_PORT = attr_atom_from_string("IP_PORT");
    }
    if (!get_int_attr(contact_attrs, CM_IP_PORT, &int_port_num)) {
	CMtrace_out(cm, CMFormatVerbose, "CMpbio port callback found no IP_PORT attribute\n");
	return 0;
    }
    CMtrace_out(cm, CMFormatVerbose, "CMpbio port callback returning %d\n", int_port_num);
    return int_port_num;
}